

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessauthenticationmanager.cpp
# Opt level: O0

void __thiscall
QNetworkAccessAuthenticationManager::cacheProxyCredentials
          (QNetworkAccessAuthenticationManager *this,QNetworkProxy *p,QAuthenticator *authenticator)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  QNetworkAccessCache *in_RDX;
  long in_FS_OFFSET;
  QNetworkAuthenticationCache *auth;
  QByteArray cacheKey;
  QNetworkProxy proxy;
  QString realm;
  QMutexLocker<QMutex> mutexLocker;
  uint in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  QNetworkAuthenticationCache *in_stack_fffffffffffffec0;
  QNetworkAuthenticationCache *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed8;
  QNetworkAuthenticationCache *entry;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int iVar4;
  QString *in_stack_ffffffffffffff08;
  QString *in_stack_ffffffffffffff10;
  QString *in_stack_ffffffffffffff18;
  QNetworkAuthenticationCache *in_stack_ffffffffffffff20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_fffffffffffffec0,
             (QMutex *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  QAuthenticator::realm((QAuthenticator *)in_stack_fffffffffffffec8);
  QNetworkProxy::QNetworkProxy
            ((QNetworkProxy *)in_stack_fffffffffffffec0,
             (QNetworkProxy *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  QAuthenticator::user((QAuthenticator *)in_stack_fffffffffffffec8);
  QNetworkProxy::setUser
            ((QNetworkProxy *)in_stack_fffffffffffffec0,
             (QString *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  QString::~QString((QString *)0x182068);
  QAuthenticator::password((QAuthenticator *)in_stack_fffffffffffffec8);
  bVar2 = QString::isNull((QString *)0x182087);
  QString::~QString((QString *)0x182098);
  if ((bVar2 & 1) == 0) {
    while( true ) {
      do {
        proxyAuthenticationKey((QNetworkProxy *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10)
        ;
        bVar3 = QByteArray::isEmpty((QByteArray *)0x18210a);
        if (bVar3) {
          in_stack_fffffffffffffeec = 1;
        }
        else {
          in_stack_fffffffffffffec0 = (QNetworkAuthenticationCache *)operator_new(0x48);
          QNetworkAuthenticationCache::QNetworkAuthenticationCache(in_stack_fffffffffffffec0);
          in_stack_fffffffffffffec8 = in_stack_fffffffffffffec0;
          entry = in_stack_fffffffffffffec0;
          QString::QString((QString *)0x182155);
          QAuthenticator::user((QAuthenticator *)in_stack_fffffffffffffec8);
          QAuthenticator::password((QAuthenticator *)in_stack_fffffffffffffec8);
          QNetworkAuthenticationCache::insert
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff08);
          QString::~QString((QString *)0x1821a8);
          QString::~QString((QString *)0x1821b5);
          QString::~QString((QString *)0x1821c2);
          QNetworkAccessCache::addEntry
                    (in_RDX,(QByteArray *)
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                     &entry->super_CacheableObject,CONCAT17(bVar2,in_stack_fffffffffffffed8));
          bVar3 = QString::isEmpty((QString *)0x1821ed);
          if (bVar3) {
            in_stack_fffffffffffffeec = 4;
          }
          else {
            QString::clear((QString *)in_stack_fffffffffffffec0);
            in_stack_fffffffffffffeec = 0;
          }
        }
        QByteArray::~QByteArray((QByteArray *)0x18221f);
      } while (in_stack_fffffffffffffeec == 0);
      if (in_stack_fffffffffffffeec != 4) break;
      iVar4 = in_stack_fffffffffffffeec;
      QNetworkProxy::user((QNetworkProxy *)in_stack_fffffffffffffec8);
      bVar3 = QString::isEmpty((QString *)0x182265);
      in_stack_fffffffffffffeb8 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffeb8);
      QString::~QString((QString *)0x182273);
      if ((in_stack_fffffffffffffeb8 & 0x1000000) != 0) break;
      QString::QString((QString *)0x182289);
      QNetworkProxy::setUser
                ((QNetworkProxy *)in_stack_fffffffffffffec0,
                 (QString *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffeb8));
      QString::~QString((QString *)0x1822a5);
      in_stack_fffffffffffffeec = iVar4;
    }
  }
  QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x1822c8);
  QString::~QString((QString *)0x1822d5);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_fffffffffffffec0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkAccessAuthenticationManager::cacheProxyCredentials(const QNetworkProxy &p,
                                                  const QAuthenticator *authenticator)
{
    Q_ASSERT(authenticator);
    Q_ASSERT(p.type() != QNetworkProxy::DefaultProxy);
    Q_ASSERT(p.type() != QNetworkProxy::NoProxy);

    QMutexLocker mutexLocker(&mutex);

    QString realm = authenticator->realm();
    QNetworkProxy proxy = p;
    proxy.setUser(authenticator->user());

    // don't cache null passwords, empty password may be valid though
    if (authenticator->password().isNull())
        return;

    // Set two credentials: one with the username and one without
    do {
        // Set two credentials actually: one with and one without the realm
        do {
            QByteArray cacheKey = proxyAuthenticationKey(proxy, realm);
            if (cacheKey.isEmpty())
                return;             // should not happen

            QNetworkAuthenticationCache *auth = new QNetworkAuthenticationCache;
            auth->insert(QString(), authenticator->user(), authenticator->password());
            authenticationCache.addEntry(cacheKey, auth); // replace the existing one, if there's any

            if (realm.isEmpty()) {
                break;
            } else {
                realm.clear();
            }
        } while (true);

        if (proxy.user().isEmpty())
            break;
        else
            proxy.setUser(QString());
    } while (true);
}